

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int64_t atol16(char *p,uint char_cnt)

{
  int digit;
  int64_t l;
  uint char_cnt_local;
  char *p_local;
  
  l = 0;
  char_cnt_local = char_cnt;
  p_local = p;
  do {
    if (char_cnt_local == 0) {
      return l;
    }
    if ((*p_local < 'a') || ('f' < *p_local)) {
      if ((*p_local < 'A') || ('F' < *p_local)) {
        if (*p_local < '0') {
          return l;
        }
        if ('9' < *p_local) {
          return l;
        }
        digit = *p_local + -0x30;
      }
      else {
        digit = *p_local + -0x37;
      }
    }
    else {
      digit = *p_local + -0x57;
    }
    p_local = p_local + 1;
    l = (long)digit | l << 4;
    char_cnt_local = char_cnt_local - 1;
  } while( true );
}

Assistant:

static int64_t
atol16(const char *p, unsigned char_cnt)
{
	int64_t l;
	int digit;

	l = 0;
	while (char_cnt-- > 0) {
		if (*p >= 'a' && *p <= 'f')
			digit = *p - 'a' + 10;
		else if (*p >= 'A' && *p <= 'F')
			digit = *p - 'A' + 10;
		else if (*p >= '0' && *p <= '9')
			digit = *p - '0';
		else
			return (l);
		p++;
		l <<= 4;
		l |= digit;
	}
	return (l);
}